

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O2

void env_container_put(Container c,int line,Environment *env)

{
  Object value;
  Record *pRVar1;
  char *__format;
  Object o;
  undefined4 uStack_5c;
  undefined8 uStack_28;
  
  pRVar1 = env_match(c.name,env);
  if (pRVar1 != (Record *)0x0) {
    __format = 
    "\x1b[31m\n[Runtime Error] [Line:%d] Identifer %s cannot be redefined as a container in the same scope!\x1b[0m"
    ;
    if ((pRVar1->object).type == OBJECT_CONTAINER) {
      __format = "\x1b[31m\n[Runtime Error] [Line:%d] Container %s is already defined!\x1b[0m";
    }
    printf(__format,line,c.name);
    stop();
  }
  value._4_4_ = uStack_5c;
  value.type = 4;
  value.field_1.instance = (Instance *)c._0_8_;
  value.field_1.routine.name = c.name;
  value.field_1._16_8_ = c._16_8_;
  value.field_1.routine.arguments = c.arguments;
  value.field_1._32_4_ = c.constructor.numStatements;
  value.field_1._36_4_ = c.constructor.blockName;
  value.field_1.container.constructor.statements = c.constructor.statements;
  value.field_1.routine.code.statements = (Statement *)uStack_28;
  rec_new(c.name,value,env);
  return;
}

Assistant:

void env_container_put(Container c, int line, Environment *env){
    Record *match = env_match(c.name, env);
    if(match != NULL){
        if(match->object.type != OBJECT_CONTAINER){
            printf(runtime_error("Identifer %s cannot be redefined as a container in the same scope!"), line, c.name);
        }
        else{
            printf(runtime_error("Container %s is already defined!"), line, c.name);
        }
        stop();
    }

    Object o;
    o.type = OBJECT_CONTAINER;
    o.container = c;

    rec_new(c.name, o, env);
}